

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected.t.cpp
# Opt level: O0

exception_ptr anon_unknown.dwarf_1bf9a::make_ep(void)

{
  exception_ptr *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_30);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at(&local_30,1);
  std::__cxx11::string::~string((string *)&local_30);
  std::__exception_ptr::exception_ptr::exception_ptr(in_RDI,(nullptr_t)0x0);
  return (exception_ptr)in_RDI;
}

Assistant:

std::exception_ptr make_ep()
{
    try
    {
        // this generates an std::out_of_range:
        (void) std::string().at(1);
    }
    catch(...)
    {
        return std::current_exception();
    }
    return nullptr;
}